

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_129_129_4_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [17];
  uint8_t plaintext [17];
  uint8_t key [17];
  uint7 in_stack_ffffffffffffffd9;
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x2d61aa49514222ab,in_stack_ffffffffffffffe0,
                    (uint8_t *)((ulong)in_stack_ffffffffffffffd9 << 8),(uint8_t *)0x79d2c18254032d99
                   );
  return iVar1;
}

Assistant:

static int LowMC_test_vector_129_129_4_2(void) {
  const uint8_t key[17] = {
      0xab, 0x22, 0x42, 0x51, 0x49, 0xaa, 0x61, 0x2d, 0x7f,
      0xff, 0x13, 0x72, 0x20, 0x27, 0x5b, 0x16, 0x80,
  };
  const uint8_t plaintext[17] = {
      0x4b, 0x99, 0x23, 0x53, 0xa6, 0x6,  0x65, 0xbf, 0x99,
      0x2d, 0x3,  0x54, 0x82, 0xc1, 0xd2, 0x79, 0x0,
  };
  const uint8_t ciphertext_expected[17] = {
      0x2a, 0x40, 0x62, 0xd8, 0x35, 0xc5, 0x93, 0xea, 0x19,
      0xf8, 0x22, 0xad, 0x24, 0x24, 0x77, 0xd2, 0x80,
  };

  return lowmc_enc(&parameters_129_129_4, key, plaintext, ciphertext_expected);
}